

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileExecutableTargetGenerator::WriteExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink)

{
  unsigned_long *puVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmGeneratorTarget *pcVar3;
  cmMakefile *pcVar4;
  bool bVar5;
  bool bVar6;
  bool useResponseFile;
  bool useWatcomQuote;
  char *pcVar7;
  string *psVar8;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar9;
  pointer s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  int minor;
  int major;
  string outpath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  real_link_commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exeCleanFiles;
  string linkLanguage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string linkFlags;
  string targetFullPathReal;
  EchoProgress progress;
  string targetFullPath;
  string targetNameImport;
  string linkRuleVar;
  string flags;
  string outpathImp;
  string targetName;
  string targetOutPath;
  string targetFullPathImport;
  string pdbOutputPath;
  string targetNameReal;
  string targetVersionMajor;
  string objectDir;
  string buildObjs;
  string linkLibs;
  string linkFlagsConfig;
  string targetOutPathReal;
  string targetFullPathPDB;
  string targetNamePDB;
  string local_390 [32];
  string targetVersionMinor;
  string target;
  string manifests;
  string linkRule;
  string targetOutPathImport;
  string targetOutPathPDB;
  string compilePdbOutputPath;
  string buildEcho;
  RuleVariables local_118;
  
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefileTargetGenerator::AppendLinkDepends(&this->super_cmMakefileTargetGenerator,&depends);
  targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
  targetName._M_string_length = 0;
  targetNameReal._M_dataplus._M_p = (pointer)&targetNameReal.field_2;
  targetNameReal._M_string_length = 0;
  targetName.field_2._M_local_buf[0] = '\0';
  targetNameReal.field_2._M_local_buf[0] = '\0';
  targetNameImport._M_dataplus._M_p = (pointer)&targetNameImport.field_2;
  targetNameImport._M_string_length = 0;
  targetNamePDB._M_dataplus._M_p = (pointer)&targetNamePDB.field_2;
  targetNamePDB._M_string_length = 0;
  targetNameImport.field_2._M_local_buf[0] = '\0';
  targetNamePDB.field_2._M_local_buf[0] = '\0';
  psVar8 = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
  cmGeneratorTarget::GetExecutableNames
            ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &targetName,&targetNameReal,&targetNameImport,&targetNamePDB,psVar8);
  cmGeneratorTarget::GetDirectory
            (&outpath,(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget,psVar8,false);
  bVar5 = cmGeneratorTarget::IsAppBundleOnApple
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (bVar5) {
    cmOSXBundleGenerator::CreateAppBundle
              ((this->super_cmMakefileTargetGenerator).OSXBundleGenerator,&targetName,&outpath);
  }
  std::__cxx11::string::append((char *)&outpath);
  outpathImp._M_dataplus._M_p = (pointer)&outpathImp.field_2;
  outpathImp._M_string_length = 0;
  outpathImp.field_2._M_local_buf[0] = '\0';
  if (relink) {
    cmMakefile::GetCurrentBinaryDirectory
              ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile);
    std::__cxx11::string::assign((char *)&outpath);
    std::__cxx11::string::append((char *)&outpath);
    std::__cxx11::string::append((char *)&outpath);
    cmsys::SystemTools::MakeDirectory(outpath._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&outpath);
    if (targetNameImport._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&outpathImp);
    }
  }
  else {
    cmsys::SystemTools::MakeDirectory(outpath._M_dataplus._M_p);
    if (targetNameImport._M_string_length != 0) {
      cmGeneratorTarget::GetDirectory
                (&progress.Dir,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,psVar8,true);
      std::__cxx11::string::operator=((string *)&outpathImp,(string *)&progress);
      std::__cxx11::string::~string((string *)&progress);
      cmsys::SystemTools::MakeDirectory(outpathImp._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&outpathImp);
    }
  }
  cmGeneratorTarget::GetCompilePDBDirectory
            (&compilePdbOutputPath,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             psVar8);
  cmsys::SystemTools::MakeDirectory(compilePdbOutputPath._M_dataplus._M_p);
  cmGeneratorTarget::GetPDBDirectory
            (&pdbOutputPath,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             psVar8);
  cmsys::SystemTools::MakeDirectory(pdbOutputPath._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&pdbOutputPath);
  std::operator+(&targetFullPath,&outpath,&targetName);
  std::operator+(&targetFullPathReal,&outpath,&targetNameReal);
  std::operator+(&targetFullPathPDB,&pdbOutputPath,&targetNamePDB);
  std::operator+(&targetFullPathImport,&outpathImp,&targetNameImport);
  cmCommonTargetGenerator::Convert
            (&targetOutPathPDB,(cmCommonTargetGenerator *)this,&targetFullPathPDB,NONE,SHELL);
  cmCommonTargetGenerator::Convert
            (&targetOutPath,(cmCommonTargetGenerator *)this,&targetFullPath,START_OUTPUT,SHELL);
  cmCommonTargetGenerator::Convert
            (&targetOutPathReal,(cmCommonTargetGenerator *)this,&targetFullPathReal,START_OUTPUT,
             SHELL);
  cmCommonTargetGenerator::Convert
            (&targetOutPathImport,(cmCommonTargetGenerator *)this,&targetFullPathImport,START_OUTPUT
             ,SHELL);
  cmGeneratorTarget::GetLinkerLanguage
            (&linkLanguage,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             psVar8);
  if (linkLanguage._M_string_length == 0) {
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    cmSystemTools::Error
              ("Cannot determine link language for target \"",(psVar8->_M_dataplus)._M_p,"\".",
               (char *)0x0);
  }
  else {
    puVar1 = &(this->super_cmMakefileTargetGenerator).NumberOfProgressActions;
    *puVar1 = *puVar1 + 1;
    if ((this->super_cmMakefileTargetGenerator).NoRuleMessages == false) {
      progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
      progress.Dir._M_string_length = 0;
      progress.Dir.field_2._M_local_buf[0] = '\0';
      progress.Arg._M_dataplus._M_p = (pointer)&progress.Arg.field_2;
      progress.Arg._M_string_length = 0;
      progress.Arg.field_2._M_local_buf[0] = '\0';
      cmMakefileTargetGenerator::MakeEchoProgress(&this->super_cmMakefileTargetGenerator,&progress);
      std::__cxx11::string::string((string *)&buildEcho,"Linking ",(allocator *)&local_118);
      std::__cxx11::string::append((string *)&buildEcho);
      std::__cxx11::string::append((char *)&buildEcho);
      std::__cxx11::string::append((string *)&buildEcho);
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      std::__cxx11::string::string
                ((string *)&local_118,buildEcho._M_dataplus._M_p,(allocator *)&flags);
      cmLocalUnixMakefileGenerator3::AppendEcho
                (pcVar2,&commands,(string *)&local_118,EchoLink,&progress);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&buildEcho);
      cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress(&progress);
    }
    flags._M_dataplus._M_p = (pointer)&flags.field_2;
    flags._M_string_length = 0;
    linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
    linkFlags._M_string_length = 0;
    flags.field_2._M_local_buf[0] = '\0';
    linkFlags.field_2._M_local_buf[0] = '\0';
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    std::__cxx11::string::string
              ((string *)&progress,"CMAKE_EXE_LINKER_FLAGS",(allocator *)&buildEcho);
    cmLocalGenerator::AddConfigVariableFlags
              ((cmLocalGenerator *)pcVar2,&linkFlags,&progress.Dir,psVar8);
    std::__cxx11::string::~string((string *)&progress);
    pcVar3 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    std::__cxx11::string::string((string *)&progress,"WIN32_EXECUTABLE",(allocator *)&buildEcho);
    bVar5 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&progress.Dir);
    std::__cxx11::string::~string((string *)&progress);
    pcVar4 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    if (bVar5) {
      std::__cxx11::string::string
                ((string *)&progress,"CMAKE_CREATE_WIN32_EXE",(allocator *)&buildEcho);
      pcVar7 = cmMakefile::GetDefinition(pcVar4,&progress.Dir);
      (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar2,&linkFlags,pcVar7);
    }
    else {
      std::__cxx11::string::string
                ((string *)&progress,"CMAKE_CREATE_CONSOLE_EXE",(allocator *)&buildEcho);
      pcVar7 = cmMakefile::GetDefinition(pcVar4,&progress.Dir);
      (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar2,&linkFlags,pcVar7);
    }
    std::__cxx11::string::~string((string *)&progress);
    bVar5 = cmGeneratorTarget::IsExecutableWithExports
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    if (bVar5) {
      std::__cxx11::string::string((string *)&progress,"CMAKE_EXE_EXPORTS_",(allocator *)&buildEcho)
      ;
      std::__cxx11::string::append((string *)&progress);
      std::__cxx11::string::append((char *)&progress);
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar7 = cmMakefile::GetDefinition
                         ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          Makefile,&progress.Dir);
      (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar2,&linkFlags,pcVar7);
      std::__cxx11::string::~string((string *)&progress);
    }
    cmCommonTargetGenerator::AddFeatureFlags((cmCommonTargetGenerator *)this,&flags,&linkLanguage);
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,&flags,
               (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
               ,&linkLanguage,psVar8);
    pcVar3 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    std::__cxx11::string::string((string *)&progress,"LINK_FLAGS",(allocator *)&buildEcho);
    pcVar7 = cmGeneratorTarget::GetProperty(pcVar3,&progress.Dir);
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar2,&linkFlags,pcVar7);
    std::__cxx11::string::~string((string *)&progress);
    std::__cxx11::string::string((string *)&linkFlagsConfig,"LINK_FLAGS_",(allocator *)&progress);
    cmsys::SystemTools::UpperCase(&progress.Dir,psVar8);
    std::__cxx11::string::append((string *)&linkFlagsConfig);
    std::__cxx11::string::~string((string *)&progress);
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar7 = cmGeneratorTarget::GetProperty
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget,&linkFlagsConfig);
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar2,&linkFlags,pcVar7);
    cmCommonTargetGenerator::AddModuleDefinitionFlag((cmCommonTargetGenerator *)this,&linkFlags);
    exeCleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    exeCleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    exeCleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmCommonTargetGenerator::Convert
              (&progress.Dir,(cmCommonTargetGenerator *)this,&targetFullPath,START_OUTPUT,UNCHANGED)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&exeCleanFiles,
               &progress.Dir);
    std::__cxx11::string::~string((string *)&progress);
    bVar5 = std::operator!=(&targetNameReal,&targetName);
    if (bVar5) {
      cmCommonTargetGenerator::Convert
                (&progress.Dir,(cmCommonTargetGenerator *)this,&targetFullPathReal,START_OUTPUT,
                 UNCHANGED);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&exeCleanFiles
                 ,&progress.Dir);
      std::__cxx11::string::~string((string *)&progress);
    }
    if (targetNameImport._M_string_length != 0) {
      cmCommonTargetGenerator::Convert
                (&progress.Dir,(cmCommonTargetGenerator *)this,&targetFullPathImport,START_OUTPUT,
                 UNCHANGED);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&exeCleanFiles
                 ,&progress.Dir);
      std::__cxx11::string::~string((string *)&progress);
      progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
      progress.Dir._M_string_length = 0;
      progress.Dir.field_2._M_local_buf[0] = '\0';
      bVar5 = cmGeneratorTarget::GetImplibGNUtoMS
                        ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget,&targetFullPathImport,&progress.Dir,(char *)0x0);
      if (bVar5) {
        cmCommonTargetGenerator::Convert
                  (&buildEcho,(cmCommonTargetGenerator *)this,&progress.Dir,START_OUTPUT,UNCHANGED);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &exeCleanFiles,&buildEcho);
        std::__cxx11::string::~string((string *)&buildEcho);
      }
      std::__cxx11::string::~string((string *)&progress);
    }
    cmCommonTargetGenerator::Convert
              (&progress.Dir,(cmCommonTargetGenerator *)this,&targetFullPathPDB,START_OUTPUT,
               UNCHANGED);
    this_00 = &(this->super_cmMakefileTargetGenerator).CleanFiles;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &progress.Dir);
    std::__cxx11::string::~string((string *)&progress);
    if (!relink) {
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pvVar9 = cmGeneratorTarget::GetPreBuildCommands
                         ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
      cmLocalUnixMakefileGenerator3::AppendCustomCommands
                (pcVar2,&commands,pvVar9,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,HOME_OUTPUT);
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pvVar9 = cmGeneratorTarget::GetPreLinkCommands
                         ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
      cmLocalUnixMakefileGenerator3::AppendCustomCommands
                (pcVar2,&commands,pvVar9,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,HOME_OUTPUT);
    }
    bVar5 = (((this->super_cmMakefileTargetGenerator).GlobalGenerator)->
            super_cmGlobalCommonGenerator).super_cmGlobalGenerator.UseLinkScript;
    real_link_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    real_link_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    real_link_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&linkRuleVar,"CMAKE_",(allocator *)&progress);
    std::__cxx11::string::append((string *)&linkRuleVar);
    std::__cxx11::string::append((char *)&linkRuleVar);
    cmMakefileTargetGenerator::GetLinkRule
              (&linkRule,&this->super_cmMakefileTargetGenerator,&linkRuleVar);
    commands1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commands1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commands1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::ExpandListArgument(&linkRule,&real_link_commands,false);
    bVar6 = cmGeneratorTarget::IsExecutableWithExports
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    if (bVar6) {
      std::__cxx11::string::string((string *)&progress,"CMAKE_",(allocator *)&buildEcho);
      std::__cxx11::string::append((string *)&progress);
      std::__cxx11::string::append((char *)&progress);
      pcVar7 = cmMakefile::GetDefinition
                         ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          Makefile,&progress.Dir);
      if (pcVar7 != (char *)0x0) {
        std::__cxx11::string::string((string *)&buildEcho,pcVar7,(allocator *)&local_118);
        cmSystemTools::ExpandListArgument(&buildEcho,&real_link_commands,false);
        std::__cxx11::string::~string((string *)&buildEcho);
      }
      std::__cxx11::string::~string((string *)&progress);
    }
    std::__cxx11::string::string((string *)&progress,"CMAKE_",(allocator *)&buildEcho);
    std::__cxx11::string::append((string *)&progress);
    std::__cxx11::string::append((char *)&progress);
    bVar6 = cmMakefile::IsOn((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                             Makefile,&progress.Dir);
    std::__cxx11::string::~string((string *)&progress);
    std::__cxx11::string::string((string *)&progress,"CMAKE_",(allocator *)&buildEcho);
    std::__cxx11::string::append((string *)&progress);
    std::__cxx11::string::append((char *)&progress);
    useResponseFile =
         cmMakefile::IsOn((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          Makefile,&progress.Dir);
    std::__cxx11::string::~string((string *)&progress);
    pcVar4 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::operator+(&progress.Dir,&linkRuleVar,"_USE_WATCOM_QUOTE");
    useWatcomQuote = cmMakefile::IsOn(pcVar4,&progress.Dir);
    std::__cxx11::string::~string((string *)&progress);
    cmOutputConverter::SetLinkScriptShell
              (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,bVar5);
    linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
    linkLibs._M_string_length = 0;
    linkLibs.field_2._M_local_buf[0] = '\0';
    cmMakefileTargetGenerator::CreateLinkLibs
              (&this->super_cmMakefileTargetGenerator,&linkLibs,relink,useResponseFile,&depends,
               useWatcomQuote);
    buildObjs._M_dataplus._M_p = (pointer)&buildObjs.field_2;
    buildObjs._M_string_length = 0;
    buildObjs.field_2._M_local_buf[0] = '\0';
    cmMakefileTargetGenerator::CreateObjectLists
              (&this->super_cmMakefileTargetGenerator,bVar5,false,bVar6,&buildObjs,&depends,
               useWatcomQuote);
    cmCommonTargetGenerator::GetManifests_abi_cxx11_(&manifests,(cmCommonTargetGenerator *)this);
    memset(&local_118.TargetPDB,0,0xe0);
    local_118.RuleLauncher = "RULE_LAUNCH_LINK";
    local_118.CMTarget =
         (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    local_118.Language = linkLanguage._M_dataplus._M_p;
    local_118.Objects = buildObjs._M_dataplus._M_p;
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&objectDir,local_118.CMTarget);
    cmCommonTargetGenerator::Convert
              (&progress.Dir,(cmCommonTargetGenerator *)this,&objectDir,START_OUTPUT,SHELL);
    std::__cxx11::string::operator=((string *)&objectDir,(string *)&progress);
    std::__cxx11::string::~string((string *)&progress);
    local_118.ObjectDir = objectDir._M_dataplus._M_p;
    cmCommonTargetGenerator::Convert
              (&target,(cmCommonTargetGenerator *)this,&targetFullPathReal,START_OUTPUT,
               useWatcomQuote | SHELL);
    local_118.Target = target._M_dataplus._M_p;
    local_118.TargetPDB = targetOutPathPDB._M_dataplus._M_p;
    targetVersionMajor._M_dataplus._M_p = (pointer)&targetVersionMajor.field_2;
    targetVersionMajor._M_string_length = 0;
    targetVersionMajor.field_2._M_local_buf[0] = '\0';
    targetVersionMinor._M_dataplus._M_p = (pointer)&targetVersionMinor.field_2;
    targetVersionMinor._M_string_length = 0;
    targetVersionMinor.field_2._M_local_buf[0] = '\0';
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&progress);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buildEcho);
    cmGeneratorTarget::GetTargetVersion
              ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
               ,&major,&minor);
    std::ostream::operator<<(&progress,major);
    std::ostream::operator<<(&buildEcho,minor);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&targetVersionMajor,local_390);
    std::__cxx11::string::~string(local_390);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&targetVersionMinor,local_390);
    std::__cxx11::string::~string(local_390);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buildEcho);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progress);
    local_118.TargetVersionMajor = targetVersionMajor._M_dataplus._M_p;
    local_118.TargetVersionMinor = targetVersionMinor._M_dataplus._M_p;
    local_118.LinkLibraries = linkLibs._M_dataplus._M_p;
    local_118.Flags = flags._M_dataplus._M_p;
    local_118.LinkFlags = linkFlags._M_dataplus._M_p;
    local_118.Manifests = manifests._M_dataplus._M_p;
    std::__cxx11::string::_M_assign
              ((string *)
               &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator.TargetImplib);
    for (s = real_link_commands.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator,
        s != real_link_commands.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
      cmLocalGenerator::ExpandRuleVariables((cmLocalGenerator *)pcVar2,s,&local_118);
    }
    std::__cxx11::string::assign
              ((char *)&(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.TargetImplib);
    cmOutputConverter::SetLinkScriptShell
              (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,false);
    std::__cxx11::string::~string((string *)&targetVersionMinor);
    std::__cxx11::string::~string((string *)&targetVersionMajor);
    std::__cxx11::string::~string((string *)&target);
    std::__cxx11::string::~string((string *)&objectDir);
    std::__cxx11::string::~string((string *)&manifests);
    std::__cxx11::string::~string((string *)&buildObjs);
    std::__cxx11::string::~string((string *)&linkLibs);
    if (bVar5 == false) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&commands1,&real_link_commands);
    }
    else {
      pcVar7 = "link.txt";
      if (relink) {
        pcVar7 = "relink.txt";
      }
      cmMakefileTargetGenerator::CreateLinkScript
                (&this->super_cmMakefileTargetGenerator,pcVar7,&real_link_commands,&commands1,
                 &depends);
    }
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar7 = cmMakefile::GetCurrentBinaryDirectory
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        Makefile);
    cmLocalUnixMakefileGenerator3::CreateCDCommand(pcVar2,&commands1,pcVar7,HOME_OUTPUT);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
               (const_iterator)
               commands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )commands1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )commands1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&commands1);
    bVar5 = std::operator!=(&targetOutPath,&targetOutPathReal);
    if (bVar5) {
      std::__cxx11::string::string
                ((string *)&progress,"$(CMAKE_COMMAND) -E cmake_symlink_executable ",
                 (allocator *)&buildEcho);
      std::__cxx11::string::append((string *)&progress);
      std::__cxx11::string::append((char *)&progress);
      std::__cxx11::string::append((string *)&progress);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&commands1,&progress.Dir);
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar7 = cmMakefile::GetCurrentBinaryDirectory
                         ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          Makefile);
      cmLocalUnixMakefileGenerator3::CreateCDCommand(pcVar2,&commands1,pcVar7,HOME_OUTPUT);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 (const_iterator)
                 commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )commands1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )commands1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands1);
      std::__cxx11::string::~string((string *)&progress);
    }
    if (!relink) {
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pvVar9 = cmGeneratorTarget::GetPostBuildCommands
                         ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
      cmLocalUnixMakefileGenerator3::AppendCustomCommands
                (pcVar2,&commands,pvVar9,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,HOME_OUTPUT);
    }
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              ((this->super_cmMakefileTargetGenerator).LocalGenerator,
               (ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,(char *)0x0,
               &targetFullPathReal,&depends,&commands,false,false);
    bVar5 = std::operator!=(&targetFullPath,&targetFullPathReal);
    if (bVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&depends);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,&targetFullPathReal);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                ((this->super_cmMakefileTargetGenerator).LocalGenerator,
                 (ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,(char *)0x0,
                 &targetFullPath,&depends,&commands,false,false);
    }
    cmMakefileTargetGenerator::WriteTargetDriverRule
              (&this->super_cmMakefileTargetGenerator,&targetFullPath,relink);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (this->super_cmMakefileTargetGenerator).CleanFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )exeCleanFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )exeCleanFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commands1);
    std::__cxx11::string::~string((string *)&linkRule);
    std::__cxx11::string::~string((string *)&linkRuleVar);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&real_link_commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&exeCleanFiles);
    std::__cxx11::string::~string((string *)&linkFlagsConfig);
    std::__cxx11::string::~string((string *)&linkFlags);
    std::__cxx11::string::~string((string *)&flags);
  }
  std::__cxx11::string::~string((string *)&linkLanguage);
  std::__cxx11::string::~string((string *)&targetOutPathImport);
  std::__cxx11::string::~string((string *)&targetOutPathReal);
  std::__cxx11::string::~string((string *)&targetOutPath);
  std::__cxx11::string::~string((string *)&targetOutPathPDB);
  std::__cxx11::string::~string((string *)&targetFullPathImport);
  std::__cxx11::string::~string((string *)&targetFullPathPDB);
  std::__cxx11::string::~string((string *)&targetFullPathReal);
  std::__cxx11::string::~string((string *)&targetFullPath);
  std::__cxx11::string::~string((string *)&pdbOutputPath);
  std::__cxx11::string::~string((string *)&compilePdbOutputPath);
  std::__cxx11::string::~string((string *)&outpathImp);
  std::__cxx11::string::~string((string *)&outpath);
  std::__cxx11::string::~string((string *)&targetNamePDB);
  std::__cxx11::string::~string((string *)&targetNameImport);
  std::__cxx11::string::~string((string *)&targetNameReal);
  std::__cxx11::string::~string((string *)&targetName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteExecutableRule(bool relink)
{
  std::vector<std::string> commands;

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends);

  // Get the name of the executable to generate.
  std::string targetName;
  std::string targetNameReal;
  std::string targetNameImport;
  std::string targetNamePDB;
  this->GeneratorTarget->GetExecutableNames
    (targetName, targetNameReal, targetNameImport, targetNamePDB,
     this->ConfigName);

  // Construct the full path version of the names.
  std::string outpath = this->GeneratorTarget->GetDirectory(this->ConfigName);
  if(this->GeneratorTarget->IsAppBundleOnApple())
    {
    this->OSXBundleGenerator->CreateAppBundle(targetName, outpath);
    }
  outpath += "/";
  std::string outpathImp;
  if(relink)
    {
    outpath = this->Makefile->GetCurrentBinaryDirectory();
    outpath += cmake::GetCMakeFilesDirectory();
    outpath += "/CMakeRelink.dir";
    cmSystemTools::MakeDirectory(outpath.c_str());
    outpath += "/";
    if(!targetNameImport.empty())
      {
      outpathImp = outpath;
      }
    }
  else
    {
    cmSystemTools::MakeDirectory(outpath.c_str());
    if(!targetNameImport.empty())
      {
      outpathImp = this->GeneratorTarget->GetDirectory(this->ConfigName, true);
      cmSystemTools::MakeDirectory(outpathImp.c_str());
      outpathImp += "/";
      }
    }

  std::string compilePdbOutputPath =
    this->GeneratorTarget->GetCompilePDBDirectory(this->ConfigName);
  cmSystemTools::MakeDirectory(compilePdbOutputPath.c_str());

  std::string pdbOutputPath =
      this->GeneratorTarget->GetPDBDirectory(this->ConfigName);
  cmSystemTools::MakeDirectory(pdbOutputPath.c_str());
  pdbOutputPath += "/";

  std::string targetFullPath = outpath + targetName;
  std::string targetFullPathReal = outpath + targetNameReal;
  std::string targetFullPathPDB =  pdbOutputPath + targetNamePDB;
  std::string targetFullPathImport = outpathImp + targetNameImport;
  std::string targetOutPathPDB =
    this->Convert(targetFullPathPDB,
                  cmLocalGenerator::NONE,
                  cmLocalGenerator::SHELL);
  // Convert to the output path to use in constructing commands.
  std::string targetOutPath =
    this->Convert(targetFullPath,
                  cmLocalGenerator::START_OUTPUT,
                  cmLocalGenerator::SHELL);
  std::string targetOutPathReal =
    this->Convert(targetFullPathReal,
                  cmLocalGenerator::START_OUTPUT,
                  cmLocalGenerator::SHELL);
  std::string targetOutPathImport =
    this->Convert(targetFullPathImport,
                  cmLocalGenerator::START_OUTPUT,
                  cmLocalGenerator::SHELL);

  // Get the language to use for linking this executable.
  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);

  // Make sure we have a link language.
  if(linkLanguage.empty())
    {
    cmSystemTools::Error("Cannot determine link language for target \"",
                         this->GeneratorTarget->GetName().c_str(), "\".");
    return;
    }

  this->NumberOfProgressActions++;
  if(!this->NoRuleMessages)
    {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = "Linking ";
    buildEcho += linkLanguage;
    buildEcho += " executable ";
    buildEcho += targetOutPath;
    this->LocalGenerator->AppendEcho(commands, buildEcho.c_str(),
                                     cmLocalUnixMakefileGenerator3::EchoLink,
                                     &progress);
    }

  // Build a list of compiler flags and linker flags.
  std::string flags;
  std::string linkFlags;

  // Add flags to create an executable.
  this->LocalGenerator->
    AddConfigVariableFlags(linkFlags, "CMAKE_EXE_LINKER_FLAGS",
                           this->ConfigName);


  if(this->GeneratorTarget->GetPropertyAsBool("WIN32_EXECUTABLE"))
    {
    this->LocalGenerator->AppendFlags
      (linkFlags, this->Makefile->GetDefinition("CMAKE_CREATE_WIN32_EXE"));
    }
  else
    {
    this->LocalGenerator->AppendFlags
      (linkFlags, this->Makefile->GetDefinition("CMAKE_CREATE_CONSOLE_EXE"));
    }

  // Add symbol export flags if necessary.
  if(this->GeneratorTarget->IsExecutableWithExports())
    {
    std::string export_flag_var = "CMAKE_EXE_EXPORTS_";
    export_flag_var += linkLanguage;
    export_flag_var += "_FLAG";
    this->LocalGenerator->AppendFlags
      (linkFlags, this->Makefile->GetDefinition(export_flag_var));
    }

  // Add language feature flags.
  this->AddFeatureFlags(flags, linkLanguage);

  this->LocalGenerator->AddArchitectureFlags(flags, this->GeneratorTarget,
                                             linkLanguage, this->ConfigName);

  // Add target-specific linker flags.
  this->LocalGenerator->AppendFlags
    (linkFlags, this->GeneratorTarget->GetProperty("LINK_FLAGS"));
  std::string linkFlagsConfig = "LINK_FLAGS_";
  linkFlagsConfig += cmSystemTools::UpperCase(this->ConfigName);
  this->LocalGenerator->AppendFlags
    (linkFlags, this->GeneratorTarget->GetProperty(linkFlagsConfig));

  this->AddModuleDefinitionFlag(linkFlags);

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> exeCleanFiles;
  exeCleanFiles.push_back(this->Convert(targetFullPath,
                                        cmLocalGenerator::START_OUTPUT,
                                        cmLocalGenerator::UNCHANGED));
#ifdef _WIN32
  // There may be a manifest file for this target.  Add it to the
  // clean set just in case.
  exeCleanFiles.push_back(this->Convert((targetFullPath+".manifest").c_str(),
                                        cmLocalGenerator::START_OUTPUT,
                                        cmLocalGenerator::UNCHANGED));
#endif
  if(targetNameReal != targetName)
    {
    exeCleanFiles.push_back(this->Convert(targetFullPathReal,
                                          cmLocalGenerator::START_OUTPUT,
                                          cmLocalGenerator::UNCHANGED));
    }
  if(!targetNameImport.empty())
    {
    exeCleanFiles.push_back(this->Convert(targetFullPathImport,
                                          cmLocalGenerator::START_OUTPUT,
                                          cmLocalGenerator::UNCHANGED));
    std::string implib;
    if(this->GeneratorTarget->GetImplibGNUtoMS(targetFullPathImport, implib))
      {
      exeCleanFiles.push_back(this->Convert(implib,
                                            cmLocalGenerator::START_OUTPUT,
                                            cmLocalGenerator::UNCHANGED));
      }
    }

  // List the PDB for cleaning only when the whole target is
  // cleaned.  We do not want to delete the .pdb file just before
  // linking the target.
  this->CleanFiles.push_back
    (this->Convert(targetFullPathPDB,
                   cmLocalGenerator::START_OUTPUT,
                   cmLocalGenerator::UNCHANGED));

  // Add the pre-build and pre-link rules building but not when relinking.
  if(!relink)
    {
    this->LocalGenerator
      ->AppendCustomCommands(commands,
                        this->GeneratorTarget->GetPreBuildCommands(),
                        this->GeneratorTarget);
    this->LocalGenerator
      ->AppendCustomCommands(commands,
                        this->GeneratorTarget->GetPreLinkCommands(),
                        this->GeneratorTarget);
    }

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  // Construct the main link rule.
  std::vector<std::string> real_link_commands;
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_LINK_EXECUTABLE";
  std::string linkRule = this->GetLinkRule(linkRuleVar);
  std::vector<std::string> commands1;
  cmSystemTools::ExpandListArgument(linkRule, real_link_commands);
  if(this->GeneratorTarget->IsExecutableWithExports())
    {
    // If a separate rule for creating an import library is specified
    // add it now.
    std::string implibRuleVar = "CMAKE_";
    implibRuleVar += linkLanguage;
    implibRuleVar += "_CREATE_IMPORT_LIBRARY";
    if(const char* rule =
       this->Makefile->GetDefinition(implibRuleVar))
      {
      cmSystemTools::ExpandListArgument(rule, real_link_commands);
      }
    }

  // Select whether to use a response file for objects.
  bool useResponseFileForObjects = false;
  {
  std::string responseVar = "CMAKE_";
  responseVar += linkLanguage;
  responseVar += "_USE_RESPONSE_FILE_FOR_OBJECTS";
  if(this->Makefile->IsOn(responseVar))
    {
    useResponseFileForObjects = true;
    }
  }

  // Select whether to use a response file for libraries.
  bool useResponseFileForLibs = false;
  {
  std::string responseVar = "CMAKE_";
  responseVar += linkLanguage;
  responseVar += "_USE_RESPONSE_FILE_FOR_LIBRARIES";
  if(this->Makefile->IsOn(responseVar))
    {
    useResponseFileForLibs = true;
    }
  }

  // Expand the rule variables.
  {
  bool useWatcomQuote = this->Makefile->IsOn(linkRuleVar+"_USE_WATCOM_QUOTE");

  // Set path conversion for link script shells.
  this->LocalGenerator->SetLinkScriptShell(useLinkScript);

  // Collect up flags to link in needed libraries.
  std::string linkLibs;
  this->CreateLinkLibs(linkLibs, relink, useResponseFileForLibs, depends,
                       useWatcomQuote);

  // Construct object file lists that may be needed to expand the
  // rule.
  std::string buildObjs;
  this->CreateObjectLists(useLinkScript, false,
                          useResponseFileForObjects, buildObjs, depends,
                          useWatcomQuote);

  std::string manifests = this->GetManifests();

  cmLocalGenerator::RuleVariables vars;
  vars.RuleLauncher = "RULE_LAUNCH_LINK";
  vars.CMTarget = this->GeneratorTarget;
  vars.Language = linkLanguage.c_str();
  vars.Objects = buildObjs.c_str();
  std::string objectDir = this->GeneratorTarget->GetSupportDirectory();
  objectDir = this->Convert(objectDir,
                            cmLocalGenerator::START_OUTPUT,
                            cmLocalGenerator::SHELL);
  vars.ObjectDir = objectDir.c_str();
  cmLocalGenerator::OutputFormat output = (useWatcomQuote) ?
    cmLocalGenerator::WATCOMQUOTE : cmLocalGenerator::SHELL;
  std::string target = this->Convert(targetFullPathReal,
                                     cmLocalGenerator::START_OUTPUT,
                                     output);
  vars.Target = target.c_str();
  vars.TargetPDB = targetOutPathPDB.c_str();

  // Setup the target version.
  std::string targetVersionMajor;
  std::string targetVersionMinor;
  {
  std::ostringstream majorStream;
  std::ostringstream minorStream;
  int major;
  int minor;
  this->GeneratorTarget->GetTargetVersion(major, minor);
  majorStream << major;
  minorStream << minor;
  targetVersionMajor = majorStream.str();
  targetVersionMinor = minorStream.str();
  }
  vars.TargetVersionMajor = targetVersionMajor.c_str();
  vars.TargetVersionMinor = targetVersionMinor.c_str();

  vars.LinkLibraries = linkLibs.c_str();
  vars.Flags = flags.c_str();
  vars.LinkFlags = linkFlags.c_str();
  vars.Manifests = manifests.c_str();

  // Expand placeholders in the commands.
  this->LocalGenerator->TargetImplib = targetOutPathImport;
  for(std::vector<std::string>::iterator i = real_link_commands.begin();
      i != real_link_commands.end(); ++i)
    {
    this->LocalGenerator->ExpandRuleVariables(*i, vars);
    }
  this->LocalGenerator->TargetImplib = "";

  // Restore path conversion to normal shells.
  this->LocalGenerator->SetLinkScriptShell(false);
  }

  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if(useLinkScript)
    {
    // Use a link script.
    const char* name = (relink? "relink.txt" : "link.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
    }
  else
    {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
    }
  this->LocalGenerator->CreateCDCommand
    (commands1,
     this->Makefile->GetCurrentBinaryDirectory(),
     cmLocalGenerator::HOME_OUTPUT);
  commands.insert(commands.end(), commands1.begin(), commands1.end());
  commands1.clear();

  // Add a rule to create necessary symlinks for the library.
  if(targetOutPath != targetOutPathReal)
    {
    std::string symlink = "$(CMAKE_COMMAND) -E cmake_symlink_executable ";
    symlink += targetOutPathReal;
    symlink += " ";
    symlink += targetOutPath;
    commands1.push_back(symlink);
    this->LocalGenerator->CreateCDCommand(commands1,
                                  this->Makefile->GetCurrentBinaryDirectory(),
                                  cmLocalGenerator::HOME_OUTPUT);
    commands.insert(commands.end(), commands1.begin(), commands1.end());
    commands1.clear();
    }

  // Add the post-build rules when building but not when relinking.
  if(!relink)
    {
    this->LocalGenerator->
      AppendCustomCommands(commands,
                       this->GeneratorTarget->GetPostBuildCommands(),
                       this->GeneratorTarget);
    }

  // Write the build rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream,
                                      0,
                                      targetFullPathReal,
                                      depends, commands, false);

  // The symlink name for the target should depend on the real target
  // so if the target version changes it rebuilds and recreates the
  // symlink.
  if(targetFullPath != targetFullPathReal)
    {
    depends.clear();
    commands.clear();
    depends.push_back(targetFullPathReal);
    this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, 0,
                                        targetFullPath,
                                        depends, commands, false);
    }

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetFullPath, relink);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(this->CleanFiles.end(),
                          exeCleanFiles.begin(),
                          exeCleanFiles.end());
}